

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result)

{
  ostream *poVar1;
  TestProperty *pTVar2;
  int i;
  int i_00;
  string kProperty;
  string kProperties;
  allocator<char> local_b9;
  TestResult *local_b8;
  allocator<char> local_b0 [32];
  string local_90 [32];
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>(local_90,"properties",local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"property",(allocator<char> *)&local_70);
  if (0 < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    poVar1 = std::operator<<(stream,"      <");
    poVar1 = std::operator<<(poVar1,local_90);
    std::operator<<(poVar1,">\n");
    local_b8 = result;
    for (i_00 = 0;
        i_00 < (int)((ulong)((long)(result->test_properties_).
                                   super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(result->test_properties_).
                                  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 6); i_00 = i_00 + 1)
    {
      pTVar2 = TestResult::GetTestProperty(result,i_00);
      poVar1 = std::operator<<(stream,"        <");
      std::operator<<(poVar1,(string *)local_b0);
      poVar1 = std::operator<<(stream," name=\"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(pTVar2->key_)._M_dataplus._M_p,&local_b9);
      EscapeXmlAttribute(&local_70,&local_50);
      poVar1 = std::operator<<(poVar1,(string *)&local_70);
      std::operator<<(poVar1,"\"");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      poVar1 = std::operator<<(stream," value=\"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(pTVar2->value_)._M_dataplus._M_p,&local_b9);
      EscapeXmlAttribute(&local_70,&local_50);
      result = local_b8;
      poVar1 = std::operator<<(poVar1,(string *)&local_70);
      std::operator<<(poVar1,"\"");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::operator<<(stream,"/>\n");
    }
    poVar1 = std::operator<<(stream,"      </");
    poVar1 = std::operator<<(poVar1,local_90);
    std::operator<<(poVar1,">\n");
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << "      <" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << "        <" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << "      </" << kProperties << ">\n";
}